

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.hpp
# Opt level: O1

void __thiscall
lattice::graph::graph(graph *this,basis *bs,unitcell *cell,size_t length,boundary_t boundary)

{
  allocator_type local_c5;
  boundary_t local_c4;
  vector<lattice::boundary_t,_std::allocator<lattice::boundary_t>_> local_c0;
  supercell local_a8;
  
  (this->bonds_).super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bonds_).super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->coordinates_).
  super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->coordinates_).
  super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->sites_).super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->coordinates_).
  super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sites_).super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sites_).super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->bonds_).super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c4 = boundary;
  supercell::supercell(&local_a8,cell->dim_,length);
  std::vector<lattice::boundary_t,_std::allocator<lattice::boundary_t>_>::vector
            (&local_c0,cell->dim_,&local_c4,&local_c5);
  init(this,(EVP_PKEY_CTX *)bs);
  if (local_c0.super__Vector_base<lattice::boundary_t,_std::allocator<lattice::boundary_t>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.
                    super__Vector_base<lattice::boundary_t,_std::allocator<lattice::boundary_t>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_c0.
                          super__Vector_base<lattice::boundary_t,_std::allocator<lattice::boundary_t>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.
                          super__Vector_base<lattice::boundary_t,_std::allocator<lattice::boundary_t>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_a8.index2lcord_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.index2lcord_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a8.index2lcord_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.index2lcord_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_a8.lcord2index_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.lcord2index_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a8.lcord2index_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.lcord2index_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  free(local_a8.nmax_.super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.m_storage.m_data)
  ;
  free(local_a8.nmin_.super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.m_storage.m_data)
  ;
  free(local_a8.rs_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
       m_data);
  free(local_a8.span_.super_PlainObjectBase<Eigen::Matrix<long,__1,__1,_0,__1,__1>_>.m_storage.
       m_data);
  return;
}

Assistant:

graph(const basis& bs, const unitcell& cell, std::size_t length,
        boundary_t boundary = boundary_t::periodic) {
    init(bs, cell, supercell(cell.dimension(), length),
         std::vector<boundary_t>(cell.dimension(), boundary));
  }